

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall HighsSimplexAnalysis::invertReport(HighsSimplexAnalysis *this)

{
  long in_RDI;
  bool bVar1;
  bool force;
  bool header;
  bool in_stack_0000002f;
  HighsSimplexAnalysis *in_stack_00000030;
  bool in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  if (**(int **)(in_RDI + 0xa8) == 0) {
    userInvertReport((HighsSimplexAnalysis *)
                     CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdf);
  }
  else {
    bVar1 = true;
    if ((-1 < *(int *)(in_RDI + 0x9a8)) && (bVar1 = true, *(int *)(in_RDI + 0x9a8) < 0x32)) {
      bVar1 = -1 < *(int *)(in_RDI + 0x9ac);
    }
    if (bVar1) {
      invertReport(in_stack_00000030,in_stack_0000002f);
      *(undefined4 *)(in_RDI + 0x9a8) = 0;
    }
    invertReport(in_stack_00000030,in_stack_0000002f);
    if (*(int *)(in_RDI + 0x118) == 0) {
      *(undefined4 *)(in_RDI + 0x9ac) = 0xffffffff;
    }
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::invertReport() {
  if (*log_options.log_dev_level) {
    const bool header = (num_invert_report_since_last_header < 0) ||
                        (num_invert_report_since_last_header > 49) ||
                        (num_iteration_report_since_last_header >= 0);
    if (header) {
      invertReport(header);
      num_invert_report_since_last_header = 0;
    }
    invertReport(false);
    // Force an iteration report header if this is an INVERT report without an
    // rebuild_reason
    if (!rebuild_reason) num_iteration_report_since_last_header = -1;
  } else {
    const bool force = false;
    userInvertReport(force);
  }
}